

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O1

ssize_t __thiscall HighsTimer::read(HighsTimer *this,int __fd,void *__buf,size_t __nbytes)

{
  double *pdVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pdVar4;
  string clock_name;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (__fd == -0x2e) {
    pbVar2 = (this->clock_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = pbVar2[-0x2e]._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar3,pcVar3 + pbVar2[-0x2e]._M_string_length);
    printf("HighsTimer: reading clock %d: %s\n",0xffffffd2,local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  pdVar1 = (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + __fd;
  if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
    pdVar4 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    std::chrono::_V2::system_clock::now();
    pdVar4 = (this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return (ssize_t)pdVar4;
}

Assistant:

double read(const HighsInt i_clock = 0  //!< Index of the clock to be read
  ) const {
    assert(i_clock >= 0);
    assert(i_clock < num_clock);
    if (i_clock == check_clock) {
      std::string clock_name = this->clock_names[check_clock];
      printf("HighsTimer: reading clock %d: %s\n", int(check_clock),
             clock_name.c_str());
    }
    double read_time;
    if (clock_start[i_clock] < 0) {
      // The clock's been started, so find the current time
      double wall_time = getWallTime();
      read_time = clock_time[i_clock] + wall_time + clock_start[i_clock];
    } else {
      // The clock is currently stopped, so read the current time
      read_time = clock_time[i_clock];
    }
    return read_time;
  }